

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc64ad.c
# Opt level: O1

int_t mc64ud_(int_t *id,int_t *mod,int_t *n,int_t *irn,int_t *lirn,int_t *ip,int_t *lenc,int_t *fc,
             int_t *iperm,int_t *num,int_t *numx,int_t *pr,int_t *arp,int_t *cv,int_t *out)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  int_t *piVar12;
  long lVar13;
  ulong unaff_RBP;
  int iVar14;
  long lVar15;
  ulong uVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  int iVar20;
  int local_94;
  int local_90;
  int local_8c;
  
  if (*id == 1) {
    uVar11 = *n;
    if ((int)uVar11 < 1) {
      unaff_RBP = 1;
    }
    else {
      unaff_RBP = 1;
      do {
        cv[unaff_RBP - 1] = 0;
        arp[unaff_RBP - 1] = 0;
        unaff_RBP = unaff_RBP + 1;
      } while ((ulong)uVar11 + 1 != unaff_RBP);
    }
    local_90 = *n;
    local_8c = local_90;
  }
  else {
    if (*mod == 1) {
      iVar17 = *n;
      if ((long)iVar17 < 1) {
        unaff_RBP = 1;
      }
      else {
        memset(arp,0,(long)iVar17 << 2);
        unaff_RBP = (ulong)(iVar17 + 1);
      }
    }
    local_8c = *numx;
    local_90 = *n - local_8c;
  }
  iVar17 = *num;
  lVar8 = (long)iVar17;
  iVar3 = *n;
  iVar9 = 0;
  if (iVar17 < iVar3) {
    iVar4 = *id;
    local_94 = iVar17 + 2;
    iVar6 = 0;
    piVar12 = n;
    lVar15 = lVar8;
    do {
      iVar17 = iVar17 + 1;
      lVar1 = lVar15 + 1;
      iVar9 = fc[lVar15 - lVar8];
      uVar19 = (ulong)iVar9;
      pr[uVar19 - 1] = -1;
      if (-1 < lVar15) {
        iVar20 = (int)lVar15 + (iVar4 + -1) * iVar3 + 1;
        iVar7 = 1;
        do {
          iVar9 = (int)uVar19;
          iVar18 = lenc[(long)iVar9 + -1];
          if (arp[(long)iVar9 + -1] < iVar18) {
            piVar12 = (int_t *)(long)(arp[(long)iVar9 + -1] + ip[(long)iVar9 + -1]);
            do {
              unaff_RBP = (ulong)irn[(long)piVar12 + -1];
              if (iperm[unaff_RBP - 1] == 0) goto LAB_0011616b;
              piVar12 = (int_t *)((long)piVar12 + 1);
            } while ((long)piVar12 < (long)(ip[(long)iVar9 + -1] + iVar18));
            arp[(long)iVar9 + -1] = iVar18;
          }
          out[(long)iVar9 + -1] = lenc[(long)iVar9 + -1] + -1;
          iVar9 = 1;
          do {
            iVar18 = (int)uVar19;
            uVar11 = out[(long)iVar18 + -1];
            if (-1 < (long)(int)uVar11) {
              iVar2 = lenc[(long)iVar18 + -1] + ip[(long)iVar18 + -1];
              iVar14 = lenc[(long)iVar18 + -1] + ip[(long)iVar18 + -1] + -1;
              uVar10 = iVar14 - uVar11;
              piVar12 = (int_t *)(ulong)uVar10;
              if ((int)uVar10 < iVar2) {
                lVar13 = 0;
                do {
                  uVar10 = irn[((long)iVar14 + lVar13 + -1) - (long)(int)uVar11];
                  unaff_RBP = (ulong)uVar10;
                  if (cv[(long)(int)uVar10 + -1] != iVar20) {
                    uVar16 = (ulong)iperm[(long)(int)uVar10 + -1];
                    cv[(long)(int)uVar10 + -1] = iVar20;
                    pr[uVar16 - 1] = iVar18;
                    out[(long)iVar18 + -1] = ~(uint)lVar13 + uVar11;
                    piVar12 = (int_t *)(ulong)(~uVar11 + iVar2 + (uint)lVar13);
                    goto LAB_00116136;
                  }
                  lVar13 = lVar13 + 1;
                } while (uVar11 + 1 != (int)lVar13);
                piVar12 = (int_t *)(ulong)((int)lVar13 + ~uVar11 + iVar2);
              }
            }
            uVar11 = pr[(long)iVar18 + -1];
            uVar16 = (ulong)uVar11;
            if (uVar11 == 0xffffffff) {
              iVar9 = iVar6 + 1;
              fc[iVar6] = iVar18;
              bVar5 = iVar6 < local_90;
              iVar6 = iVar9;
              if (bVar5) goto LAB_001161e8;
              goto LAB_00116246;
            }
            iVar9 = iVar9 + 1;
            uVar19 = (ulong)uVar11;
          } while (iVar9 != local_94);
LAB_00116136:
          iVar7 = iVar7 + 1;
          iVar9 = (int)uVar16;
          uVar19 = uVar16 & 0xffffffff;
        } while (iVar7 != local_94);
      }
LAB_0011616b:
      iperm[(long)(int)unaff_RBP + -1] = iVar9;
      arp[(long)iVar9 + -1] = ((int)piVar12 - ip[(long)iVar9 + -1]) + 1;
      *num = *num + 1;
      if (-1 < lVar15) {
        iVar7 = iVar17;
        for (iVar9 = pr[(long)iVar9 + -1]; iVar9 != -1; iVar9 = pr[(long)iVar9 + -1]) {
          uVar11 = ((ip[(long)iVar9 + -1] + lenc[(long)iVar9 + -1]) - out[(long)iVar9 + -1]) - 2;
          piVar12 = (int_t *)(ulong)uVar11;
          unaff_RBP = (ulong)irn[(long)(int)uVar11 + -1];
          iperm[unaff_RBP - 1] = iVar9;
          iVar7 = iVar7 + -1;
          if (iVar7 == 0) break;
        }
      }
      iVar9 = iVar6;
      if (*num == local_8c) {
LAB_00116246:
        iVar17 = (int)lVar1;
        goto LAB_00116259;
      }
LAB_001161e8:
      local_94 = local_94 + 1;
      lVar15 = lVar1;
      iVar9 = iVar6;
    } while (lVar1 != iVar3);
  }
  iVar17 = *n;
LAB_00116259:
  iVar3 = *n;
  if (iVar17 < iVar3) {
    lVar15 = 0;
    do {
      fc[iVar9 + lVar15] = fc[(iVar17 + lVar15) - lVar8];
      lVar15 = lVar15 + 1;
    } while ((long)iVar3 - (long)iVar17 != lVar15);
  }
  return 0;
}

Assistant:

int_t mc64ud_(int_t *id, int_t *mod, int_t *n, int_t *
	irn, int_t *lirn, int_t *ip, int_t *lenc, int_t *fc, int_t *
	iperm, int_t *num, int_t *numx, int_t *pr, int_t *arp, 
	int_t *cv, int_t *out)
{
    /* System generated locals */
    int_t i__1, i__2, i__3, i__4;

    /* Local variables */
    int_t i__, j, k, j1, ii, kk, id0, id1, in1, in2, nfc, num0, num1, num2, 
	    jord, last;


/* *** Copyright (c) 1999  Council for the Central Laboratory of the */
/*     Research Councils                                             *** */
/* *** Although every effort has been made to ensure robustness and  *** */
/* *** reliability of the subroutines in this MC64 suite, we         *** */
/* *** disclaim any liability arising through the use or misuse of   *** */
/* *** any of the subroutines.                                       *** */
/* *** Any problems?   Contact ... */
/*     Iain Duff (I.Duff@rl.ac.uk) or Jacko Koster (jak@ii.uib.no)   *** */

/* PR(J) is the previous column to J in the depth first search. */
/*   Array PR is used as workspace in the sorting algorithm. */
/* Elements (I,IPERM(I)) I=1,..,N are entries at the end of the */
/*   algorithm unless N assignments have not been made in which case */
/*   N-NUM pairs (I,IPERM(I)) will not be entries in the matrix. */
/* CV(I) is the most recent loop number (ID+JORD) at which row I */
/*   was visited. */
/* ARP(J) is the number of entries in column J which have been scanned */
/*   when looking for a cheap assignment. */
/* OUT(J) is one less than the number of entries in column J which have */
/*   not been scanned during one pass through the main loop. */
/* NUMX is maximum possible size of matching. */
    /* Parameter adjustments */
    --out;
    --cv;
    --arp;
    --pr;
    --iperm;
    --fc;
    --lenc;
    --ip;
    --irn;

    /* Function Body */
    if (*id == 1) {
/* The first call to MC64U/UD. */
/* Initialize CV and ARP; parameters MOD, NUMX are not accessed */
	i__1 = *n;
	for (i__ = 1; i__ <= i__1; ++i__) {
	    cv[i__] = 0;
	    arp[i__] = 0;
/* L5: */
	}
	num1 = *n;
	num2 = *n;
    } else {
/* Not the first call to MC64U/UD. */
/* Re-initialize ARP if entries were deleted since last call to MC64U/UD */
	if (*mod == 1) {
	    i__1 = *n;
	    for (i__ = 1; i__ <= i__1; ++i__) {
		arp[i__] = 0;
/* L8: */
	    }
	}
	num1 = *numx;
	num2 = *n - *numx;
    }
    num0 = *num;
/* NUM0 is size of input matching */
/* NUM1 is maximum possible size of matching */
/* NUM2 is maximum allowed number of unassigned rows/columns */
/* NUM is size of current matching */
/* Quick return if possible */
/*      IF (NUM.EQ.N) GO TO 199 */
/* NFC is number of rows/columns that could not be assigned */
    nfc = 0;
/* Integers ID0+1 to ID0+N are unique numbers for call ID to MC64U/UD, */
/* so 1st call uses 1..N, 2nd call uses N+1..2N, etc */
    id0 = (*id - 1) * *n;
/* Main loop. Each pass round this loop either results in a new */
/* assignment or gives a column with no assignment */
    i__1 = *n;
    for (jord = num0 + 1; jord <= i__1; ++jord) {
/* Each pass uses unique number ID1 */
	id1 = id0 + jord;
/* J is unmatched column */
	j = fc[jord - num0];
	pr[j] = -1;
	i__2 = jord;
	for (k = 1; k <= i__2; ++k) {
/* Look for a cheap assignment */
	    if (arp[j] >= lenc[j]) {
		goto L30;
	    }
	    in1 = ip[j] + arp[j];
	    in2 = ip[j] + lenc[j] - 1;
	    i__3 = in2;
	    for (ii = in1; ii <= i__3; ++ii) {
		i__ = irn[ii];
		if (iperm[i__] == 0) {
		    goto L80;
		}
/* L20: */
	    }
/* No cheap assignment in row */
	    arp[j] = lenc[j];
/* Begin looking for assignment chain starting with row J */
L30:
	    out[j] = lenc[j] - 1;
/* Inner loop.  Extends chain by one or backtracks */
	    i__3 = jord;
	    for (kk = 1; kk <= i__3; ++kk) {
		in1 = out[j];
		if (in1 < 0) {
		    goto L50;
		}
		in2 = ip[j] + lenc[j] - 1;
		in1 = in2 - in1;
/* Forward scan */
		i__4 = in2;
		for (ii = in1; ii <= i__4; ++ii) {
		    i__ = irn[ii];
		    if (cv[i__] == id1) {
			goto L40;
		    }
/* Column J has not yet been accessed during this pass */
		    j1 = j;
		    j = iperm[i__];
		    cv[i__] = id1;
		    pr[j] = j1;
		    out[j1] = in2 - ii - 1;
		    goto L70;
L40:
		    ;
		}
/* Backtracking step. */
L50:
		j1 = pr[j];
		if (j1 == -1) {
/* No augmenting path exists for column J. */
		    ++nfc;
		    fc[nfc] = j;
		    if (nfc > num2) {
/* A matching of maximum size NUM1 is not possible */
			last = jord;
			goto L101;
		    }
		    goto L100;
		}
		j = j1;
/* L60: */
	    }
/* End of dummy loop; this point is never reached */
L70:
	    ;
	}
/* End of dummy loop; this point is never reached */
/* New assignment is made. */
L80:
	iperm[i__] = j;
	arp[j] = ii - ip[j] + 1;
	++(*num);
	i__2 = jord;
	for (k = 1; k <= i__2; ++k) {
	    j = pr[j];
	    if (j == -1) {
		goto L95;
	    }
	    ii = ip[j] + lenc[j] - out[j] - 2;
	    i__ = irn[ii];
	    iperm[i__] = j;
/* L90: */
	}
/* End of dummy loop; this point is never reached */
L95:
	if (*num == num1) {
/* A matching of maximum size NUM1 is found */
	    last = jord;
	    goto L101;
	}

L100:
	;
    }
/* All unassigned columns have been considered */
    last = *n;
/* Now, a transversal is computed or is not possible. */
/* Complete FC before returning. */
L101:
    i__1 = *n;
    for (jord = last + 1; jord <= i__1; ++jord) {
	++nfc;
	fc[nfc] = fc[jord - num0];
/* L110: */
    }
/*  199 RETURN */
    return 0;
}